

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

QString * __thiscall QLibrary::fileName(QLibrary *this)

{
  long lVar1;
  bool bVar2;
  Type *pTVar3;
  QMutexLocker<QMutex> *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffb8;
  QMutexLocker<QMutex> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QTaggedPointer::operator_cast_to_bool
                    ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c55c0);
  if (bVar2) {
    QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
              ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c55ef);
    QMutexLocker<QMutex>::QMutexLocker(this_00,in_stack_ffffffffffffffb8);
    QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
              ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c560e);
    bVar2 = QString::isEmpty((QString *)0x8c561d);
    if (bVar2) {
      pTVar3 = QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
                         ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c5631);
    }
    else {
      pTVar3 = QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
                         ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c5645);
      pTVar3 = (Type *)&pTVar3->qualifiedFileName;
    }
    QString::QString((QString *)this_00,&pTVar3->fileName);
    QMutexLocker<QMutex>::~QMutexLocker(this_00);
  }
  else {
    QString::QString((QString *)0x8c5673);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QLibrary::fileName() const
{
    if (d) {
        QMutexLocker locker(&d->mutex);
        return d->qualifiedFileName.isEmpty() ? d->fileName : d->qualifiedFileName;
    }
    return QString();
}